

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::TessellationShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,TessellationShaderTestInstance *this,
          VkQueryPool queryPool)

{
  VkQueryPipelineStatisticFlags VVar1;
  bool bVar2;
  VkResult result_00;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  TestStatus *pTVar5;
  ulong uVar6;
  ulong uVar7;
  allocator<char> local_61;
  TestStatus *local_60;
  string local_58;
  deUint64 result;
  
  local_60 = __return_storage_ptr__;
  pDVar3 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  pVVar4 = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  result = 0;
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags;
  if (VVar1 == 0x200) {
    uVar6 = 100;
    uVar7 = 400;
  }
  else if (VVar1 == 0x100) {
    uVar6 = 4;
    uVar7 = 0x10;
  }
  else {
    uVar7 = 0;
    uVar6 = 0;
  }
  result_00 = (*pDVar3->_vptr_DeviceInterface[0x20])
                        (pDVar3,pVVar4,queryPool.m_internal,0,1,8,&result,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x723);
  if (result < uVar6 || uVar7 < result) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"QueryPoolResults incorrect",&local_61);
    pTVar5 = local_60;
    tcu::TestStatus::fail(local_60,&local_58);
  }
  else {
    bVar2 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Pass",&local_61);
      pTVar5 = local_60;
      tcu::TestStatus::pass(local_60,&local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Result image doesn\'t match expected image.",&local_61);
      pTVar5 = local_60;
      tcu::TestStatus::fail(local_60,&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  return pTVar5;
}

Assistant:

tcu::TestStatus TessellationShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expectedMin	= 0u;
	deUint64				expectedMax	= 0u;
	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT:
			expectedMin = 4u;
			expectedMax = expectedMin * 4u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT:
			expectedMin = 100u;
			expectedMax = expectedMin * 4u;
			break;
		default:
			DE_ASSERT(0);
			break;
	}
	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (result < expectedMin || result > expectedMax)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if (!checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}